

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dzeroless(Forth *this)

{
  uint valueLo;
  uint valueHi;
  uint local_38;
  anon_union_8_4_a234c5df_for_data_ aStack_18;
  bool result;
  DCell d1;
  Forth *this_local;
  
  d1.data_ = (anon_union_8_4_a234c5df_for_data_)this;
  requireDStackDepth(this,2,"D0<");
  valueLo = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell((DCell *)&stack0xffffffffffffffe8,valueLo,valueHi);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if ((long)aStack_18 < 0) {
    local_38 = this->True;
  }
  else {
    local_38 = this->False;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_38);
  return;
}

Assistant:

void dzeroless(){
			REQUIRE_DSTACK_DEPTH(2, "D0<");
			DCell d1(dStack.getTop(1), dStack.getTop());
			auto result = d1.data_.SDcells<0;
			dStack.pop();
			dStack.setTop(0, result? True : False);
		}